

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1450.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  int i_1;
  long lVar2;
  int *piVar3;
  int i;
  int iVar4;
  int iVar5;
  int f;
  int m;
  int s;
  int w;
  int b;
  int n;
  vector<int,_std::allocator<int>_> res;
  int local_68;
  int local_64;
  e local_60;
  int local_54;
  int local_50;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c);
  std::istream::operator>>(piVar1,&local_64);
  local_60.a = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,0x1fe,&local_60.a,
             (allocator_type *)&local_68);
  for (iVar4 = 0; iVar4 < local_64; iVar4 = iVar4 + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_68);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_50);
    std::istream::operator>>(piVar1,&local_54);
    local_60.a = local_68 + -1;
    local_60.b = local_50 + -1;
    local_60.w = local_54;
    std::vector<e,_std::allocator<e>_>::emplace_back<e>(&v,&local_60);
  }
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_60.a);
  std::istream::operator>>(piVar1,&local_68);
  lVar2 = (long)local_60.a;
  local_60.a = local_60.a + -1;
  local_68 = local_68 + -1;
  local_48._M_impl.super__Vector_impl_data._M_start[lVar2 + -1] = 0;
  for (iVar4 = 0; iVar4 < local_4c + -1; iVar4 = iVar4 + 1) {
    piVar3 = &(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start)
              ->w;
    for (lVar2 = 0; lVar2 < local_64; lVar2 = lVar2 + 1) {
      if (local_48._M_impl.super__Vector_impl_data._M_start[((e *)(piVar3 + -2))->a] != -1) {
        iVar5 = local_48._M_impl.super__Vector_impl_data._M_start[((e *)(piVar3 + -2))->a] + *piVar3
        ;
        if (local_48._M_impl.super__Vector_impl_data._M_start[piVar3[-1]] < iVar5) {
          local_48._M_impl.super__Vector_impl_data._M_start[piVar3[-1]] = iVar5;
        }
      }
      piVar3 = piVar3 + 3;
    }
  }
  if (local_48._M_impl.super__Vector_impl_data._M_start[local_68] == -1) {
    std::operator<<((ostream *)&std::cout,"No solution");
  }
  else {
    std::ostream::operator<<
              ((ostream *)&std::cout,local_48._M_impl.super__Vector_impl_data._M_start[local_68]);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int main() {
    int n, m;
    std::cin >> n >> m;
    std::vector<int> res(510, -1);
    for (int i = 0; i < m; ++i) {
        int a, b, w;
        std::cin >> a >> b >> w;
        v.push_back({a - 1, b - 1, w});
    }
    int s, f;
    std::cin >> s >> f;
    s--;
    f--;
    res[s] = 0;

    for (int i = 0; i < n - 1; ++i) {
        for (int j = 0; j < m; ++j) {
            if (res[v[j].a] != -1 && res[v[j].b] < res[v[j].a] + v[j].w) {
                res[v[j].b] = res[v[j].a] + v[j].w;
            }
        }
    }
    if (res[f] != -1) {
        std::cout << res[f];
    } else {
        std::cout << "No solution";
    }

    return 0;
}